

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19174::AckermannTask::inputsAvailable(AckermannTask *this,TaskInterface ti)

{
  int iVar1;
  TaskInterface local_38;
  ValueType local_28;
  
  local_38.ctx = ti.ctx;
  local_38.impl = ti.impl;
  if (this->m == 0) {
    iVar1 = this->n + 1;
  }
  else {
    iVar1 = (this->recursiveResultA).value;
    if (iVar1 == 0) {
      __assert_fail("recursiveResultA != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xb4,
                    "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                   );
    }
    if ((this->n != 0) && (iVar1 = (this->recursiveResultB).value, iVar1 == 0)) {
      __assert_fail("recursiveResultB != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xba,
                    "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                   );
    }
  }
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 4;
  *local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = (uchar)iVar1;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar1 >> 8);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar1 >> 0x10);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (uchar)((uint)iVar1 >> 0x18);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  llbuild::core::TaskInterface::complete(&local_38,&local_28,false);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
    if (m == 0) {
      ti.complete(AckermannValue(n + 1));
      return;
    }

    assert(recursiveResultA != 0);
    if (n == 0) {
      ti.complete(recursiveResultA);
      return;
    }

    assert(recursiveResultB != 0);
    ti.complete(recursiveResultB);
  }